

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O1

bool __thiscall SWDParser::IsOperation(SWDParser *this,SWDOperation *tran)

{
  vector<SWDBit,_std::allocator<SWDBit>_> *pvVar1;
  vector<SWDBit,_std::allocator<SWDBit>_> *pvVar2;
  pointer *ppSVar3;
  SWDBit *pSVar4;
  pointer pSVar5;
  iterator iVar6;
  undefined8 uVar7;
  vector<SWDBit,std::allocator<SWDBit>> *this_00;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  uint uVar12;
  size_t __n;
  bool bVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  long lVar17;
  pointer pSVar18;
  long lVar19;
  pointer pSVar20;
  SWDBit local_98;
  vector<SWDBit,std::allocator<SWDBit>> *local_68;
  vector<SWDBit,_std::allocator<SWDBit>_> *local_60;
  SWDBit local_58;
  
  tran->data = 0;
  tran->data_parity = '\0';
  tran->data_parity_ok = false;
  tran->reg = SWDR_undefined;
  tran->APnDP = false;
  tran->RnW = false;
  tran->addr = '\0';
  tran->parity_read = '\0';
  tran->request_byte = '\0';
  tran->ACK = '\0';
  pSVar18 = (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar18) {
    (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.super__Vector_impl_data
    ._M_finish = pSVar18;
  }
  pvVar1 = &tran->bits;
  BufferBits(this,0xc);
  tran->request_byte = '\0';
  lVar15 = 0;
  bVar10 = 0;
  do {
    bVar8 = bVar10;
    bVar16 = (*(int *)((long)&((this->mBitsBuffer).
                               super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                               super__Vector_impl_data._M_start)->state_rising + lVar15) == 1) << 7;
    bVar9 = bVar8 >> 1;
    bVar10 = bVar9 | bVar16;
    lVar15 = lVar15 + 0x28;
  } while (lVar15 != 0x140);
  tran->request_byte = bVar10;
  if ((bVar9 & 0xc1 | bVar16) == 0x81) {
    tran->APnDP = (bool)((bVar9 & 2) >> 1);
    tran->RnW = (bool)(bVar8 >> 3 & 1);
    tran->addr = (bVar9 & 0x18) >> 1;
    bVar11 = (bool)((bVar9 & 0x20) >> 5);
    tran->parity_read = bVar11;
    pSVar18 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((((pSVar18[4].state_rising != BIT_HIGH) != (pSVar18[3].state_rising == BIT_HIGH)) !=
        ((pSVar18[2].state_rising == BIT_HIGH) != (pSVar18[1].state_rising == BIT_HIGH))) != bVar11)
    {
      SWDOperation::SetRegister(tran,this->mSelectRegister);
      pSVar18 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar10 = (pSVar18[0xb].state_rising == BIT_HIGH) << 2 |
               (pSVar18[10].state_rising == BIT_HIGH) * '\x02' | pSVar18[9].state_rising == BIT_HIGH
      ;
      tran->ACK = bVar10;
      if (bVar10 == 1) {
        BufferBits(this,0x2d);
        pSVar18 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (tran->RnW == false) {
          BufferBits(this,0x2e);
          pSVar18 = pSVar18 + 0xd;
        }
        else {
          pSVar18 = pSVar18 + 0xc;
        }
        pvVar2 = &this->mBitsBuffer;
        tran->data = 0;
        lVar15 = 0;
        bVar10 = 0;
        uVar12 = 0;
        do {
          uVar14 = uVar12 >> 1;
          bVar11 = *(int *)((long)&pSVar18->state_rising + lVar15) == 1;
          uVar12 = uVar14 + 0x80000000;
          if (!bVar11) {
            uVar12 = uVar14;
          }
          bVar10 = bVar10 ^ bVar11;
          lVar15 = lVar15 + 0x28;
        } while (lVar15 != 0x500);
        tran->data = uVar12;
        bVar11 = pSVar18[0x20].state_rising == BIT_HIGH;
        tran->data_parity = bVar11;
        bVar11 = (bool)(bVar10 ^ bVar11);
        bVar13 = (bool)(bVar11 ^ 1);
        tran->data_parity_ok = bVar13;
        if (bVar11) {
          return bVar13;
        }
        if ((tran->reg == SWDR_DP_SELECT) && (tran->RnW == false)) {
          this->mSelectRegister = tran->data;
        }
        lVar19 = -0x20;
        lVar15 = 0x500;
        while (lVar17 = lVar15, pSVar20 = (pointer)((long)&pSVar18[1].state_rising + lVar17),
              local_68 = (vector<SWDBit,std::allocator<SWDBit>> *)pvVar2, local_60 = pvVar1,
              pSVar20 < (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
          lVar19 = lVar19 + -1;
          lVar15 = lVar17 + 0x28;
          if (pSVar20->state_rising == BIT_HIGH) {
            pSVar18 = (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                super__Vector_impl_data._M_finish != pSVar18) {
              (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
              super__Vector_impl_data._M_finish = pSVar18;
            }
            pSVar4 = (pvVar2->super__Vector_base<SWDBit,_std::allocator<SWDBit>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<SWDBit*,std::back_insert_iterator<std::vector<SWDBit,std::allocator<SWDBit>>>>
                      (pSVar4,(SWDBit *)((long)&pSVar4[1].state_rising + lVar17),
                       (back_insert_iterator<std::vector<SWDBit,_std::allocator<SWDBit>_>_>)pvVar1);
            if (lVar19 == 0) {
              return bVar13;
            }
            pSVar20 = (pvVar2->super__Vector_base<SWDBit,_std::allocator<SWDBit>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pSVar18 = (pointer)((long)&pSVar20[1].state_rising + lVar17);
            pSVar5 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl
                     .super__Vector_impl_data._M_finish;
            if (pSVar18 != pSVar5) {
              memmove(pSVar20,pSVar18,(long)pSVar5 + (-lVar15 - (long)pSVar20));
            }
            if (lVar15 == 0) {
              return bVar13;
            }
            (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)(this->mBitsBuffer).
                                 super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                                 super__Vector_impl_data._M_finish - lVar15);
            return bVar13;
          }
        }
        ParseBit(&local_58,this);
        pvVar1 = local_60;
        this_00 = local_68;
        local_98.low_end = local_58.low_end;
        local_98.rising = local_58.rising;
        local_98.falling = local_58.falling;
        local_98.state_rising = local_58.state_rising;
        local_98.state_falling = local_58.state_falling;
        uVar7 = local_98._0_8_;
        local_98.low_start = local_58.low_start;
        local_98.state_rising = local_58.state_rising;
        bVar11 = local_98.state_rising != BIT_HIGH;
        local_98._0_8_ = uVar7;
        if (bVar11) {
          do {
            iVar6._M_current =
                 (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<SWDBit,std::allocator<SWDBit>>::_M_realloc_insert<SWDBit_const&>
                        (this_00,iVar6,&local_98);
            }
            else {
              (iVar6._M_current)->low_end = local_58.low_end;
              (iVar6._M_current)->rising = local_58.rising;
              (iVar6._M_current)->falling = local_58.falling;
              (iVar6._M_current)->state_rising = local_58.state_rising;
              (iVar6._M_current)->state_falling = local_58.state_falling;
              (iVar6._M_current)->low_start = local_58.low_start;
              ppSVar3 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppSVar3 = *ppSVar3 + 1;
            }
            ParseBit(&local_58,this);
            local_98.low_end = local_58.low_end;
            local_98.rising = local_58.rising;
            local_98.falling = local_58.falling;
            local_98.state_rising = local_58.state_rising;
            local_98.state_falling = local_58.state_falling;
            uVar7 = local_98._0_8_;
            local_98.low_start = local_58.low_start;
            local_98.state_rising = local_58.state_rising;
            bVar11 = local_98.state_rising != BIT_HIGH;
            local_98._0_8_ = uVar7;
          } while (bVar11);
        }
        std::vector<SWDBit,_std::allocator<SWDBit>_>::operator=
                  (pvVar1,(vector<SWDBit,_std::allocator<SWDBit>_> *)this_00);
        pSVar18 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_finish != pSVar18) {
          (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
          super__Vector_impl_data._M_finish = pSVar18;
        }
        iVar6._M_current =
             (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current !=
            (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          (iVar6._M_current)->low_end = local_98.low_end;
          (iVar6._M_current)->rising = local_98.rising;
          (iVar6._M_current)->falling = local_98.falling;
          (iVar6._M_current)->state_rising = local_98.state_rising;
          (iVar6._M_current)->state_falling = local_98.state_falling;
          (iVar6._M_current)->low_start = local_98.low_start;
          ppSVar3 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppSVar3 = *ppSVar3 + 1;
          return bVar13;
        }
        std::vector<SWDBit,std::allocator<SWDBit>>::_M_realloc_insert<SWDBit_const&>
                  (this_00,iVar6,&local_98);
        return bVar13;
      }
      if ((bVar10 == 4) || (bVar10 == 2)) {
        pSVar18 = (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_finish != pSVar18) {
          (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
          super__Vector_impl_data._M_finish = pSVar18;
        }
        pSVar4 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<SWDBit*,std::back_insert_iterator<std::vector<SWDBit,std::allocator<SWDBit>>>>
                  (pSVar4,pSVar4 + 0xc,
                   (back_insert_iterator<std::vector<SWDBit,_std::allocator<SWDBit>_>_>)pvVar1);
        pSVar18 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar20 = pSVar18 + 0xc;
        __n = (long)(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pSVar20;
        if (__n != 0) {
          memmove(pSVar18,pSVar20,__n);
        }
        pSVar5 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pSVar18 = (pointer)((long)pSVar18 + ((long)pSVar5 - (long)pSVar20));
        if (pSVar5 == pSVar18) {
          return true;
        }
        (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar18;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SWDParser::IsOperation( SWDOperation& tran )
{
    tran.Clear();

    // read enough bits so that we don't have to worry of subscripts out of range
    BufferBits( TRAN_REQ_AND_ACK );

    // turn the bits into a byte
    tran.request_byte = 0;
    for( size_t cnt = 0; cnt < 8; ++cnt )
    {
        tran.request_byte >>= 1;
        tran.request_byte |= ( mBitsBuffer[ cnt ].IsHigh() ? 0x80 : 0 );
    }

    // are the request's constant bits (start, stop & park) wrong?
    if( ( tran.request_byte & 0xC1 ) != 0x81 )
        return false;

    // get the indivitual bits
    tran.APnDP = ( tran.request_byte & 0x02 ) != 0;                   //(mBitsBuffer[1].state_falling == BIT_HIGH);
    tran.RnW = ( tran.request_byte & 0x04 ) != 0;                     //(mBitsBuffer[2].state_falling == BIT_HIGH);
    tran.addr = ( tran.request_byte & 0x18 ) >> 1;                    //(mBitsBuffer[3].state_falling == BIT_HIGH ? (1<<2) : 0)
                                                                      //| (mBitsBuffer[4].state_falling == BIT_HIGH ? (1<<3) : 0);
    tran.parity_read = ( ( tran.request_byte & 0x20 ) != 0 ? 1 : 0 ); //(mBitsBuffer[5].state_falling == BIT_HIGH ? 1 : 0);

    // check parity
    int check = ( mBitsBuffer[ 1 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 2 ].state_rising == BIT_HIGH ? 1 : 0 ) +
                ( mBitsBuffer[ 3 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 4 ].state_rising == BIT_HIGH ? 1 : 0 );

    if( tran.parity_read != ( check & 1 ) )
        return false;

    // Set the actual register in this operation based on the data from the request
    // and the previous select register state.
    tran.SetRegister( mSelectRegister );

    // get the ACK value
    tran.ACK = ( mBitsBuffer[ 9 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 10 ].state_rising == BIT_HIGH ? 2 : 0 ) +
               ( mBitsBuffer[ 11 ].state_rising == BIT_HIGH ? 4 : 0 );

    // we're only handling OK, WAIT and FAULT responses
    if( tran.ACK == ACK_WAIT || tran.ACK == ACK_FAULT )
    {
        // copy this operation's bits
        tran.bits.clear();
        std::copy( mBitsBuffer.begin(), mBitsBuffer.begin() + TRAN_REQ_AND_ACK, std::back_inserter( tran.bits ) );

        // consume this operation's bits
        mBitsBuffer.erase( mBitsBuffer.begin(), mBitsBuffer.begin() + TRAN_REQ_AND_ACK );

        return true;
    }

    if( tran.ACK != ACK_OK )
        return false;

    BufferBits( TRAN_READ_LENGTH );

    // turnaround if write operation
    bool read_rising = true;
    std::vector<SWDBit>::iterator bi( mBitsBuffer.begin() + 12 );
    if( !tran.IsRead() )
    {
        BufferBits( TRAN_WRITE_LENGTH );
        ++bi;
        // !!! read_rising = false;
    }

    // read the data
    tran.data = 0;
    check = 0;
    size_t ndx;
    for( ndx = 0; ndx < 32; ndx++ )
    {
        tran.data >>= 1;

        if( bi[ ndx ].IsHigh( read_rising ) )
        {
            tran.data |= 0x80000000;
            ++check;
        }
    }

    // data parity
    tran.data_parity = bi[ ndx ].IsHigh( read_rising ) ? 1 : 0;

    tran.data_parity_ok = ( tran.data_parity == ( check & 1 ) );

    if( !tran.data_parity_ok )
        return false;

    // if this is a SELECT register write, remember the value
    if( tran.reg == SWDR_DP_SELECT && !tran.RnW )
        mSelectRegister = tran.data;

    // buffered trailing zeros
    ++ndx;
    bool all_zeros = true;
    while( bi + ndx < mBitsBuffer.end() )
    {
        if( bi[ ndx ].IsHigh( read_rising ) )
        {
            all_zeros = false;
            break;
        }

        ++ndx;
    }

    // if we haven't seen a high bit carry on until we do
    if( all_zeros )
    {
        // read the remaining zero bits
        SWDBit bit;
        while( 1 )
        {
            bit = ParseBit();
            if( bit.IsHigh( read_rising ) )
                break;

            mBitsBuffer.push_back( bit );
        }

        // give the bits to the tran object
        tran.bits = mBitsBuffer;
        mBitsBuffer.clear();

        // keep the high bit because that one is probably next operation's start bit
        mBitsBuffer.push_back( bit );
    }
    else
    {
        // copy this operation's bits
        tran.bits.clear();
        std::copy( mBitsBuffer.begin(), mBitsBuffer.begin() + ndx, std::back_inserter( tran.bits ) );

        // remove this operation's bits from the buffer
        mBitsBuffer.erase( mBitsBuffer.begin(), mBitsBuffer.begin() + ndx );
    }

    return true;
}